

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O2

bool __thiscall Liby::http::RequestParser::ParseURI(RequestParser *this,char *begin,char *end)

{
  byte bVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  int iVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  
  if (((end != (char *)0x0) && (begin != (char *)0x0)) && (begin <= end)) {
    iVar8 = (int)end - (int)begin;
    uVar2 = (ulong)(iVar8 + 1);
    uVar4 = 0xffffffffffffffff;
    if (-1 < (long)uVar2) {
      uVar4 = uVar2;
    }
    pvVar3 = operator_new__(uVar4,(nothrow_t *)&std::nothrow);
    if (pvVar3 == (void *)0x0) {
      iVar8 = 7;
    }
    else {
      uVar2 = 0;
      uVar4 = 0xffffffffffffffff;
      for (iVar5 = 0; iVar5 < iVar8; iVar5 = iVar5 + 1) {
        cVar6 = begin[iVar5];
        if (cVar6 == '%') {
          bVar1 = begin[(long)iVar5 + 2] - 0x30;
          bVar7 = (begin[(long)iVar5 + 2] | 0x20U) + 0xa9;
          if (bVar1 < 10) {
            bVar7 = bVar1;
          }
          cVar6 = ((9 < (byte)(begin[(long)iVar5 + 1] - 0x30U)) * '\t' + begin[(long)iVar5 + 1]) *
                  '\x10' + bVar7;
          iVar5 = iVar5 + 2;
        }
        *(char *)((long)pvVar3 + uVar2) = cVar6;
        if (cVar6 == '?') {
          *(undefined1 *)((long)pvVar3 + uVar2) = 0;
          uVar4 = uVar2 & 0xffffffff;
        }
        uVar2 = uVar2 + 1;
      }
      *(undefined1 *)((long)pvVar3 + (uVar2 & 0xffffffff)) = 0;
      if ((int)uVar4 != -1) {
        std::__cxx11::string::assign((char *)&(this->super_Request).query_);
      }
      std::__cxx11::string::assign((char *)&(this->super_Request).uri_);
      iVar8 = 3;
    }
    this->progress_ = iVar8;
    return pvVar3 != (void *)0x0;
  }
  __assert_fail("begin <= end && begin && end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpDef.cpp"
                ,0xd2,"bool Liby::http::RequestParser::ParseURI(const char *, const char *)");
}

Assistant:

bool RequestParser::ParseURI(const char *begin, const char *end) {
    assert(begin <= end && begin && end);

    do {
        int query_index = -1;
        int n = end - begin;
        const char *src = begin;
        char *temp = new (std::nothrow) char[n + 1];
        if (temp == nullptr)
            break;
        int i = 0, j = 0;
        for (; i < n; i++, j++) {
            if (src[i] == '%') {
                temp[j] = parse_hex(src + i + 1);
                i += 2;
            } else {
                temp[j] = src[i];
            }
            if (temp[j] == '?') {
                query_index = j;
                temp[j] = '\0';
            }
        }
        temp[j] = '\0';

        if (query_index != -1)
            query_ = &temp[query_index + 1];
        uri_ = temp;
        progress_ = ParsingVersion;
        return true;
    } while (0);

    progress_ = InvalidURI;
    return false;
}